

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_result_modifier.cpp
# Opt level: O2

double __thiscall duckdb::BoundLimitNode::GetConstantPercentage(BoundLimitNode *this)

{
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  if (this->type == CONSTANT_PERCENTAGE) {
    return this->constant_percentage;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,
             "BoundLimitNode::GetConstantPercentage called but limit is not a constant percentage",
             &local_39);
  InternalException::InternalException(this_00,&local_38);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

double BoundLimitNode::GetConstantPercentage() const {
	if (Type() != LimitNodeType::CONSTANT_PERCENTAGE) {
		throw InternalException("BoundLimitNode::GetConstantPercentage called but limit is not a constant percentage");
	}
	return constant_percentage;
}